

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticQuad>::GradX
          (TPZGeoElRefLess<pzgeom::TPZQuadraticQuad> *this,TPZVec<Fad<double>_> *par,
          TPZFMatrix<Fad<double>_> *gradx)

{
  TPZGeoNode *pTVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  TPZFNMatrix<54,_double> cornerco;
  TPZFMatrix<double> local_278;
  double local_1e8 [55];
  
  (*(gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xd])(gradx,3,2);
  local_278.fElem = local_1e8;
  local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 8;
  local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01882128;
  local_278.fSize = 0x36;
  lVar2 = 0;
  local_278.fGiven = local_278.fElem;
  TPZVec<int>::TPZVec(&local_278.fPivot.super_TPZVec<int>,0);
  local_278.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_278.fPivot.super_TPZVec<int>.fStore = local_278.fPivot.fExtAlloc;
  local_278.fPivot.super_TPZVec<int>.fNElements = 0;
  local_278.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_278.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_278.fWork.fStore = (double *)0x0;
  local_278.fWork.fNElements = 0;
  local_278.fWork.fNAlloc = 0;
  local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01881e38;
  lVar4 = 0;
  do {
    pTVar1 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(((this->super_TPZGeoEl).fMesh)->fNodeVec).
                         super_TPZChunkVector<TPZGeoNode,_10>,
                        (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes
                        [lVar4]);
    lVar3 = 0;
    do {
      if ((local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar3) ||
         (local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar4)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      *(REAL *)((long)local_278.fElem +
               lVar3 * 8 + lVar2 * local_278.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) =
           pTVar1->fCoord[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar4 = lVar4 + 1;
    lVar2 = lVar2 + 8;
    if (lVar4 == 8) {
      pzgeom::TPZQuadraticQuad::GradX<Fad<double>>(&local_278,par,gradx);
      TPZFMatrix<double>::~TPZFMatrix(&local_278,&PTR_PTR_018820f0);
      return;
    }
  } while( true );
}

Assistant:

void
TPZGeoElRefLess<TGeo>::GradX(TPZVec<Fad<REAL> > &par, TPZFMatrix<Fad<REAL> > &gradx) const
{
    gradx.Resize(3,fGeo.Dimension);
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
    fGeo.GradX(cornerco,par,gradx);
}